

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void auto_commit_test(void)

{
  fdb_encryption_key new_key;
  void *ptr;
  fdb_doc *doc;
  long lVar1;
  fdb_iterator **ppfVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  fdb_kvs_handle **ptr_handle;
  size_t sVar6;
  size_t sVar7;
  fdb_kvs_handle *pfVar8;
  fdb_config *pfVar9;
  long lVar10;
  fdb_doc **ppfVar11;
  fdb_doc *pfVar12;
  char *ptr_handle_00;
  uint uVar13;
  size_t *unaff_RBP;
  fdb_doc *__s;
  char *unaff_R12;
  fdb_iterator **doc_00;
  fdb_kvs_handle *unaff_R13;
  fdb_file_handle **ptr_fhandle;
  char *unaff_R14;
  ulong uVar14;
  fdb_doc **doc_01;
  fdb_iterator **ptr_iterator;
  fdb_kvs_handle *unaff_R15;
  char *pcVar15;
  fdb_kvs_handle **ptr_handle_01;
  char *handle;
  bool bVar16;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  size_t valuelen;
  void *value_out;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char value [256];
  char key [256];
  fdb_config fconfig;
  fdb_kvs_handle *pfStack_1bae0;
  fdb_file_handle *pfStack_1bad8;
  void *pvStack_1bad0;
  size_t asStack_1bac8 [3];
  undefined4 uStack_1bab0;
  undefined4 uStack_1baac;
  undefined4 uStack_1baa8;
  undefined4 uStack_1baa4;
  undefined4 uStack_1baa0;
  fdb_kvs_config fStack_1ba98;
  timeval tStack_1ba80;
  fdb_config fStack_1ba70;
  char acStack_1b978 [256];
  char acStack_1b878 [256];
  char acStack_1b778 [264];
  fdb_config *pfStack_1b670;
  fdb_iterator **ppfStack_1b668;
  fdb_kvs_handle *pfStack_1b660;
  fdb_iterator **ppfStack_1b658;
  fdb_kvs_handle *pfStack_1b650;
  code *pcStack_1b648;
  fdb_iterator *pfStack_1b630;
  fdb_file_handle *pfStack_1b628;
  fdb_kvs_handle *pfStack_1b620;
  fdb_kvs_handle *pfStack_1b618;
  fdb_kvs_config fStack_1b610;
  timeval tStack_1b5f8;
  fdb_config fStack_1b5e8;
  fdb_iterator *apfStack_1b4f0 [32];
  fdb_config fStack_1b3f0;
  fdb_kvs_handle **ppfStack_1b2e8;
  fdb_iterator **ppfStack_1b2e0;
  fdb_iterator **ppfStack_1b2d8;
  fdb_kvs_handle *pfStack_1b2d0;
  fdb_iterator *pfStack_1b2c0;
  fdb_kvs_handle *pfStack_1b2b8;
  fdb_iterator **ppfStack_1b2b0;
  fdb_kvs_handle *pfStack_1b2a8;
  fdb_kvs_config fStack_1b2a0;
  fdb_kvs_handle *apfStack_1b288 [8];
  undefined1 auStack_1b248 [64];
  fdb_iterator *apfStack_1b208 [33];
  fdb_config fStack_1b100;
  fdb_iterator *apfStack_1b008 [32];
  fdb_iterator *apfStack_1af08 [32];
  fdb_kvs_handle fStack_1ae08;
  undefined8 auStack_1aa08 [896];
  fdb_kvs_handle *apfStack_18e08 [1025];
  fdb_doc **ppfStack_16e00;
  char *pcStack_16df8;
  long lStack_16df0;
  fdb_doc *pfStack_16de8;
  fdb_doc **ppfStack_16de0;
  fdb_doc *pfStack_16dd8;
  fdb_doc *pfStack_16dc0;
  fdb_file_handle *pfStack_16db8;
  long lStack_16db0;
  fdb_kvs_handle *pfStack_16da8;
  long lStack_16da0;
  long lStack_16d98;
  fdb_doc **ppfStack_16d90;
  long lStack_16d88;
  fdb_doc **ppfStack_16d80;
  size_t sStack_16d78;
  timeval tStack_16d70;
  fdb_kvs_config fStack_16d60;
  fdb_file_info fStack_16d48;
  fdb_doc afStack_16d00 [3];
  char acStack_16c00 [264];
  fdb_config fStack_16af8;
  char acStack_16a00 [256];
  fdb_doc *apfStack_16900 [2999];
  size_t sStack_10b48;
  size_t asStack_10b40 [1023];
  undefined1 auStack_eb41 [57225];
  fdb_doc **ppfStack_bb8;
  fdb_config *pfStack_bb0;
  fdb_file_handle **ppfStack_ba8;
  ulong uStack_ba0;
  fdb_kvs_handle **ppfStack_b98;
  fdb_kvs_handle **ppfStack_b90;
  fdb_doc *pfStack_b78;
  fdb_kvs_handle *pfStack_b70;
  undefined1 auStack_b68 [24];
  fdb_file_handle *pfStack_b50;
  fdb_kvs_handle *pfStack_b48;
  fdb_kvs_config fStack_b40;
  fdb_doc *apfStack_b28 [31];
  timeval tStack_a30;
  fdb_config fStack_a20;
  char acStack_928 [256];
  fdb_file_handle *apfStack_828 [32];
  char acStack_728 [264];
  fdb_kvs_handle **ppfStack_620;
  char *pcStack_618;
  char *pcStack_610;
  ulong uStack_608;
  undefined8 uStack_600;
  code *pcStack_5f8;
  fdb_file_handle *pfStack_5f0;
  fdb_kvs_handle *pfStack_5e8;
  char acStack_5e0 [32];
  fdb_kvs_config fStack_5c0;
  timeval tStack_5a8;
  fdb_file_info afStack_598 [3];
  fdb_config fStack_4a0;
  fdb_config *pfStack_3a8;
  char *pcStack_3a0;
  fdb_kvs_handle *pfStack_398;
  char *pcStack_390;
  fdb_kvs_handle *pfStack_388;
  code *pcStack_380;
  fdb_kvs_handle *local_370;
  fdb_file_handle *local_368;
  size_t local_360;
  fdb_kvs_handle *local_358;
  fdb_kvs_config local_350;
  timeval local_338;
  char local_328 [256];
  char local_228 [256];
  fdb_config local_128;
  
  pcStack_380 = (code *)0x1180a9;
  gettimeofday(&local_338,(__timezone_ptr_t)0x0);
  pcStack_380 = (code *)0x1180ae;
  memleak_start();
  pcStack_380 = (code *)0x1180ba;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar9 = &local_128;
  pcStack_380 = (code *)0x1180ca;
  fdb_get_default_config();
  pcStack_380 = (code *)0x1180d4;
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.wal_threshold = 0x1000;
  local_128.flags = 1;
  local_128.durability_opt = '\x02';
  local_128.auto_commit = true;
  pcStack_380 = (code *)0x118107;
  fVar3 = fdb_open(&local_368,"dummy1",pfVar9);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183bc;
  pcStack_380 = (code *)0x118123;
  fVar3 = fdb_kvs_open_default(local_368,&local_370,&local_350);
  pcVar15 = (char *)unaff_R15;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183c1;
  pcVar15 = "body%d";
  unaff_RBP = (size_t *)0x0;
  do {
    pcStack_380 = (code *)0x118154;
    sprintf(local_228,"key%d",unaff_RBP);
    pcStack_380 = (code *)0x118163;
    sprintf(local_328,"body%d",unaff_RBP);
    unaff_R13 = local_370;
    pcStack_380 = (code *)0x118170;
    sVar5 = strlen(local_228);
    pfVar9 = (fdb_config *)(sVar5 + 1);
    pcStack_380 = (code *)0x11817c;
    sVar5 = strlen(local_328);
    pcStack_380 = (code *)0x118191;
    fVar3 = fdb_set_kv(unaff_R13,local_228,(size_t)pfVar9,local_328,sVar5 + 1);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_380 = (code *)0x118398;
      auto_commit_test();
      goto LAB_00118398;
    }
    uVar13 = (int)unaff_RBP + 1;
    unaff_RBP = (size_t *)(ulong)uVar13;
  } while (uVar13 != 5000);
  unaff_R14 = local_228;
  unaff_R12 = local_328;
  unaff_R13 = (fdb_kvs_handle *)&local_358;
  unaff_RBP = &local_360;
  pfVar9 = (fdb_config *)0x0;
  do {
    pcStack_380 = (code *)0x1181cf;
    sprintf(unaff_R14,"key%d",pfVar9);
    pcStack_380 = (code *)0x1181e2;
    sprintf(unaff_R12,"body%d",pfVar9);
    pfVar8 = local_370;
    pcStack_380 = (code *)0x1181ef;
    sVar5 = strlen(unaff_R14);
    pcStack_380 = (code *)0x118204;
    fVar3 = fdb_get_kv(pfVar8,unaff_R14,sVar5 + 1,(void **)unaff_R13,unaff_RBP);
    pcVar15 = (char *)local_358;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183a5;
    pcStack_380 = (code *)0x118221;
    iVar4 = bcmp(local_358,unaff_R12,local_360);
    if (iVar4 != 0) goto LAB_00118398;
    pcStack_380 = (code *)0x118231;
    fdb_free_block(pcVar15);
    uVar13 = (int)pfVar9 + 1;
    pfVar9 = (fdb_config *)(ulong)uVar13;
  } while (uVar13 != 5000);
  pcStack_380 = (code *)0x118245;
  fVar3 = fdb_kvs_close(local_370);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183c6;
  pcStack_380 = (code *)0x118257;
  fVar3 = fdb_close(local_368);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183cb;
  pcStack_380 = (code *)0x118278;
  fVar3 = fdb_open(&local_368,"dummy1",&local_128);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183d0;
  pcStack_380 = (code *)0x118294;
  fVar3 = fdb_kvs_open_default(local_368,&local_370,&local_350);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183d5;
  unaff_R14 = local_228;
  unaff_R12 = local_328;
  unaff_R13 = (fdb_kvs_handle *)&local_358;
  unaff_RBP = &local_360;
  pfVar9 = (fdb_config *)0x0;
  do {
    pcStack_380 = (code *)0x1182c8;
    sprintf(unaff_R14,"key%d",pfVar9);
    pcStack_380 = (code *)0x1182db;
    sprintf(unaff_R12,"body%d",pfVar9);
    unaff_R15 = local_370;
    pcStack_380 = (code *)0x1182e8;
    sVar5 = strlen(unaff_R14);
    pcStack_380 = (code *)0x1182fd;
    fVar3 = fdb_get_kv(unaff_R15,unaff_R14,sVar5 + 1,(void **)unaff_R13,unaff_RBP);
    pcVar15 = (char *)local_358;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183b7;
    pcStack_380 = (code *)0x11831a;
    iVar4 = bcmp(local_358,unaff_R12,local_360);
    if (iVar4 != 0) goto LAB_001183aa;
    pcStack_380 = (code *)0x11832a;
    fdb_free_block(pcVar15);
    uVar13 = (int)pfVar9 + 1;
    pfVar9 = (fdb_config *)(ulong)uVar13;
  } while (uVar13 != 5000);
  pcStack_380 = (code *)0x11833e;
  fVar3 = fdb_close(local_368);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_380 = (code *)0x11834b;
    fdb_shutdown();
    pcStack_380 = (code *)0x118350;
    memleak_end();
    pcVar15 = "%s PASSED\n";
    if (auto_commit_test()::__test_pass != '\0') {
      pcVar15 = "%s FAILED\n";
    }
    pcStack_380 = (code *)0x118381;
    fprintf(_stderr,pcVar15,"auto commit test");
    return;
  }
  goto LAB_001183da;
LAB_0011968a:
  pfStack_1b2d0 = (fdb_kvs_handle *)0x11968f;
  open_multi_files_kvs_test();
LAB_0011968f:
  pfStack_1b2d0 = (fdb_kvs_handle *)0x119694;
  open_multi_files_kvs_test();
LAB_00119694:
  pfStack_1b2d0 = (fdb_kvs_handle *)0x119699;
  open_multi_files_kvs_test();
LAB_00119699:
  pfStack_1b2d0 = (fdb_kvs_handle *)0x11969e;
  open_multi_files_kvs_test();
  pfVar8 = (fdb_kvs_handle *)handle;
LAB_0011969e:
  pfStack_1b2d0 = (fdb_kvs_handle *)0x1196a3;
  open_multi_files_kvs_test();
LAB_001196a3:
  pfStack_1b2d0 = (fdb_kvs_handle *)0x1196a8;
  open_multi_files_kvs_test();
LAB_001196a8:
  pfStack_1b2d0 = (fdb_kvs_handle *)0x1196ad;
  open_multi_files_kvs_test();
LAB_001196ad:
  pfStack_1b2d0 = (fdb_kvs_handle *)0x1196b2;
  open_multi_files_kvs_test();
LAB_001196b2:
  pfStack_1b2d0 = (fdb_kvs_handle *)0x1196b7;
  open_multi_files_kvs_test();
  goto LAB_001196b7;
LAB_00119c56:
  rekey_test();
  goto LAB_00119c66;
LAB_00118398:
  pcStack_380 = (code *)0x1183a5;
  auto_commit_test();
  pfVar8 = (fdb_kvs_handle *)pcVar15;
LAB_001183a5:
  pcVar15 = (char *)pfVar8;
  pcStack_380 = (code *)0x1183aa;
  auto_commit_test();
LAB_001183aa:
  pcStack_380 = (code *)0x1183b7;
  auto_commit_test();
  unaff_R15 = (fdb_kvs_handle *)pcVar15;
LAB_001183b7:
  unaff_R14 = local_228;
  unaff_R12 = local_328;
  pcStack_380 = (code *)0x1183bc;
  auto_commit_test();
LAB_001183bc:
  pcStack_380 = (code *)0x1183c1;
  auto_commit_test();
  pcVar15 = (char *)unaff_R15;
LAB_001183c1:
  pcStack_380 = (code *)0x1183c6;
  auto_commit_test();
LAB_001183c6:
  pcStack_380 = (code *)0x1183cb;
  auto_commit_test();
LAB_001183cb:
  pcStack_380 = (code *)0x1183d0;
  auto_commit_test();
LAB_001183d0:
  pcStack_380 = (code *)0x1183d5;
  auto_commit_test();
LAB_001183d5:
  pcStack_380 = (code *)0x1183da;
  auto_commit_test();
LAB_001183da:
  pcStack_380 = auto_commit_space_used_test;
  auto_commit_test();
  pcStack_5f8 = (code *)0x1183fc;
  pfStack_3a8 = pfVar9;
  pcStack_3a0 = unaff_R12;
  pfStack_398 = unaff_R13;
  pcStack_390 = unaff_R14;
  pfStack_388 = (fdb_kvs_handle *)pcVar15;
  pcStack_380 = (code *)unaff_RBP;
  gettimeofday(&tStack_5a8,(__timezone_ptr_t)0x0);
  pcStack_5f8 = (code *)0x118401;
  memleak_start();
  pcStack_5f8 = (code *)0x11840d;
  system("rm -rf  func_test* > errorlog.txt");
  pcStack_5f8 = (code *)0x11841d;
  fdb_get_default_config();
  fStack_4a0.buffercache_size = 0;
  fStack_4a0.auto_commit = true;
  pcStack_5f8 = (code *)0x118436;
  fdb_get_default_config();
  pcStack_5f8 = (code *)0x118446;
  memcpy(&fStack_4a0,afStack_598,0xf8);
  pcStack_5f8 = (code *)0x118450;
  fdb_get_default_kvs_config();
  uVar14 = 0xfffffffc;
  while( true ) {
    builtin_strncpy(acStack_5e0 + 8,"est1",5);
    builtin_strncpy(acStack_5e0,"./func_t",8);
    pcStack_5f8 = (code *)0x11849b;
    fVar3 = fdb_open(&pfStack_5f0,acStack_5e0,&fStack_4a0);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pcStack_5f8 = (code *)0x1184b7;
    fVar3 = fdb_kvs_open(pfStack_5f0,&pfStack_5e8,"justonekv",&fStack_5c0);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_5f8 = (code *)0x118570;
      auto_commit_space_used_test();
      break;
    }
    pcStack_5f8 = (code *)0x1184cd;
    fVar3 = fdb_get_file_info(pfStack_5f0,afStack_598);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011857a;
    if (afStack_598[0].file_size != fStack_4a0.blocksize * 7) {
      pcStack_5f8 = (code *)0x11851c;
      auto_commit_space_used_test();
    }
    pcStack_5f8 = (code *)0x1184f8;
    fVar3 = fdb_close(pfStack_5f0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118575;
    uVar13 = (int)uVar14 + 1;
    uVar14 = (ulong)uVar13;
    if (uVar13 == 0) {
      pcStack_5f8 = (code *)0x118523;
      fdb_shutdown();
      pcStack_5f8 = (code *)0x118528;
      memleak_end();
      pcVar15 = "%s PASSED\n";
      if (auto_commit_space_used_test()::__test_pass != '\0') {
        pcVar15 = "%s FAILED\n";
      }
      pcStack_5f8 = (code *)0x118559;
      fprintf(_stderr,pcVar15,"auto_commit space used on close test");
      return;
    }
  }
  pcStack_5f8 = (code *)0x118575;
  auto_commit_space_used_test();
LAB_00118575:
  pcStack_5f8 = (code *)0x11857a;
  auto_commit_space_used_test();
LAB_0011857a:
  pcStack_5f8 = last_wal_flush_header_test;
  auto_commit_space_used_test();
  uStack_600 = 0x745f636e75662f2e;
  pcStack_610 = "justonekv";
  ppfStack_b90 = (fdb_kvs_handle **)0x1185a2;
  ppfStack_620 = &pfStack_5e8;
  pcStack_618 = acStack_5e0;
  uStack_608 = uVar14;
  pcStack_5f8 = (code *)&pfStack_5f0;
  gettimeofday(&tStack_a30,(__timezone_ptr_t)0x0);
  ppfStack_b90 = (fdb_kvs_handle **)0x1185a7;
  memleak_start();
  pfStack_b78 = (fdb_doc *)0x0;
  ppfStack_b90 = (fdb_kvs_handle **)0x1185b8;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_b90 = (fdb_kvs_handle **)0x1185c8;
  fdb_get_default_config();
  ppfStack_b90 = (fdb_kvs_handle **)0x1185d5;
  fdb_get_default_kvs_config();
  fStack_a20.buffercache_size = 0;
  fStack_a20.flags = 1;
  fStack_a20.purging_interval = 0;
  fStack_a20.compaction_threshold = '\0';
  ppfStack_b90 = (fdb_kvs_handle **)0x118608;
  fdb_open((fdb_file_handle **)(auStack_b68 + 0x10),"dummy1",&fStack_a20);
  ppfStack_b90 = (fdb_kvs_handle **)0x11861b;
  fdb_open((fdb_file_handle **)auStack_b68,"dummy1",&fStack_a20);
  ppfStack_b90 = (fdb_kvs_handle **)0x11862c;
  fdb_kvs_open_default((fdb_file_handle *)auStack_b68._16_8_,&pfStack_b70,&fStack_b40);
  ppfStack_b90 = (fdb_kvs_handle **)0x11863d;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_b68._0_8_,(fdb_kvs_handle **)(auStack_b68 + 8),&fStack_b40);
  ppfVar11 = apfStack_b28;
  uVar14 = 0;
  do {
    ppfStack_b90 = (fdb_kvs_handle **)0x118661;
    sprintf(acStack_928,"key%d",uVar14 & 0xffffffff);
    ppfStack_b90 = (fdb_kvs_handle **)0x11867d;
    sprintf(acStack_728,"meta%d",uVar14 & 0xffffffff);
    ptr_fhandle = apfStack_828;
    ppfStack_b90 = (fdb_kvs_handle **)0x118699;
    sprintf((char *)ptr_fhandle,"body%d",uVar14 & 0xffffffff);
    ppfStack_b90 = (fdb_kvs_handle **)0x1186a1;
    ptr_handle = (fdb_kvs_handle **)strlen(acStack_928);
    ppfStack_b90 = (fdb_kvs_handle **)0x1186ac;
    sVar5 = strlen(acStack_728);
    ppfStack_b90 = (fdb_kvs_handle **)0x1186b7;
    sVar6 = strlen((char *)ptr_fhandle);
    ppfStack_b90 = (fdb_kvs_handle **)0x1186d7;
    fdb_doc_create(ppfVar11,acStack_928,(size_t)ptr_handle,acStack_728,sVar5,ptr_fhandle,sVar6);
    uVar14 = uVar14 + 1;
    ppfVar11 = ppfVar11 + 1;
  } while (uVar14 != 0x1e);
  ppfStack_b90 = (fdb_kvs_handle **)0x1186f7;
  fdb_set(pfStack_b70,apfStack_b28[0]);
  ppfStack_b90 = (fdb_kvs_handle **)0x118706;
  fdb_set(pfStack_b70,apfStack_b28[1]);
  ppfStack_b90 = (fdb_kvs_handle **)0x118715;
  fdb_begin_transaction((fdb_file_handle *)auStack_b68._0_8_,'\x02');
  lVar10 = 0;
  do {
    ppfStack_b90 = (fdb_kvs_handle **)0x118726;
    fdb_set((fdb_kvs_handle *)auStack_b68._8_8_,apfStack_b28[lVar10 + 2]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_b90 = (fdb_kvs_handle **)0x118741;
  fdb_commit((fdb_file_handle *)auStack_b68._16_8_,'\x01');
  ppfStack_b90 = (fdb_kvs_handle **)0x118749;
  fdb_close((fdb_file_handle *)auStack_b68._16_8_);
  ppfStack_b90 = (fdb_kvs_handle **)0x118756;
  fdb_close((fdb_file_handle *)auStack_b68._0_8_);
  ptr_handle_01 = (fdb_kvs_handle **)0x1541a5;
  pfVar9 = &fStack_a20;
  ppfStack_b90 = (fdb_kvs_handle **)0x118773;
  fdb_open((fdb_file_handle **)(auStack_b68 + 0x10),"dummy1",pfVar9);
  ppfStack_b90 = (fdb_kvs_handle **)0x118781;
  fdb_open((fdb_file_handle **)auStack_b68,"dummy1",pfVar9);
  ppfStack_b90 = (fdb_kvs_handle **)0x118796;
  fdb_kvs_open_default((fdb_file_handle *)auStack_b68._16_8_,&pfStack_b70,&fStack_b40);
  ppfStack_b90 = (fdb_kvs_handle **)0x1187a6;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_b68._0_8_,(fdb_kvs_handle **)(auStack_b68 + 8),&fStack_b40);
  uVar14 = 0;
  do {
    ppfStack_b90 = (fdb_kvs_handle **)0x1187d2;
    fdb_doc_create(&pfStack_b78,apfStack_b28[uVar14]->key,apfStack_b28[uVar14]->keylen,(void *)0x0,0
                   ,(void *)0x0,0);
    ppfStack_b90 = (fdb_kvs_handle **)0x1187e1;
    fVar3 = fdb_get(pfStack_b70,pfStack_b78);
    if (uVar14 < 2) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118d89;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118d8e;
    ppfStack_b90 = (fdb_kvs_handle **)0x118802;
    fdb_doc_free(pfStack_b78);
    pfStack_b78 = (fdb_doc *)0x0;
    uVar14 = uVar14 + 1;
  } while (uVar14 != 4);
  ppfStack_b90 = (fdb_kvs_handle **)0x118823;
  fdb_begin_transaction((fdb_file_handle *)auStack_b68._0_8_,'\x02');
  lVar10 = 0;
  do {
    ppfStack_b90 = (fdb_kvs_handle **)0x118834;
    fdb_set((fdb_kvs_handle *)auStack_b68._8_8_,apfStack_b28[lVar10 + 2]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  lVar10 = 0;
  do {
    ppfStack_b90 = (fdb_kvs_handle **)0x118851;
    fdb_set(pfStack_b70,apfStack_b28[lVar10 + 4]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_b90 = (fdb_kvs_handle **)0x11886c;
  fdb_end_transaction((fdb_file_handle *)auStack_b68._0_8_,'\x01');
  ppfStack_b90 = (fdb_kvs_handle **)0x118879;
  fdb_close((fdb_file_handle *)auStack_b68._16_8_);
  ppfStack_b90 = (fdb_kvs_handle **)0x118881;
  fdb_close((fdb_file_handle *)auStack_b68._0_8_);
  ptr_handle_01 = (fdb_kvs_handle **)0x1541a5;
  pfVar9 = &fStack_a20;
  ppfStack_b90 = (fdb_kvs_handle **)0x11889e;
  fdb_open((fdb_file_handle **)(auStack_b68 + 0x10),"dummy1",pfVar9);
  ppfStack_b90 = (fdb_kvs_handle **)0x1188ac;
  fdb_open((fdb_file_handle **)auStack_b68,"dummy1",pfVar9);
  ppfStack_b90 = (fdb_kvs_handle **)0x1188c1;
  fdb_kvs_open_default((fdb_file_handle *)auStack_b68._16_8_,&pfStack_b70,&fStack_b40);
  ppfStack_b90 = (fdb_kvs_handle **)0x1188d1;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_b68._0_8_,(fdb_kvs_handle **)(auStack_b68 + 8),&fStack_b40);
  uVar14 = 0;
  do {
    ppfStack_b90 = (fdb_kvs_handle **)0x1188fd;
    fdb_doc_create(&pfStack_b78,apfStack_b28[uVar14]->key,apfStack_b28[uVar14]->keylen,(void *)0x0,0
                   ,(void *)0x0,0);
    ppfStack_b90 = (fdb_kvs_handle **)0x11890c;
    fVar3 = fdb_get(pfStack_b70,pfStack_b78);
    if ((uVar14 < 4) && (fVar3 != FDB_RESULT_SUCCESS)) {
      ppfStack_b90 = (fdb_kvs_handle **)0x118d84;
      last_wal_flush_header_test();
      goto LAB_00118d84;
    }
    ppfStack_b90 = (fdb_kvs_handle **)0x118924;
    fdb_doc_free(pfStack_b78);
    pfStack_b78 = (fdb_doc *)0x0;
    uVar14 = uVar14 + 1;
  } while (uVar14 != 6);
  lVar10 = 0;
  do {
    ppfStack_b90 = (fdb_kvs_handle **)0x11894a;
    fdb_set(pfStack_b70,apfStack_b28[lVar10 + 4]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_b90 = (fdb_kvs_handle **)0x118962;
  fdb_begin_transaction((fdb_file_handle *)auStack_b68._0_8_,'\x02');
  lVar10 = 0;
  do {
    ppfStack_b90 = (fdb_kvs_handle **)0x118976;
    fdb_set((fdb_kvs_handle *)auStack_b68._8_8_,apfStack_b28[lVar10 + 6]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_b90 = (fdb_kvs_handle **)0x11898e;
  fdb_commit((fdb_file_handle *)auStack_b68._16_8_,'\x01');
  ppfStack_b90 = (fdb_kvs_handle **)0x1189aa;
  fdb_open(&pfStack_b50,"dummy1",&fStack_a20);
  ppfStack_b90 = (fdb_kvs_handle **)0x1189bc;
  fdb_kvs_open_default(pfStack_b50,&pfStack_b48,&fStack_b40);
  ppfStack_b90 = (fdb_kvs_handle **)0x1189c9;
  fdb_begin_transaction(pfStack_b50,'\x02');
  lVar10 = 0;
  do {
    ppfStack_b90 = (fdb_kvs_handle **)0x1189dd;
    fdb_set(pfStack_b48,apfStack_b28[lVar10 + 8]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_b90 = (fdb_kvs_handle **)0x1189f5;
  fdb_end_transaction(pfStack_b50,'\x01');
  ppfStack_b90 = (fdb_kvs_handle **)0x118a02;
  fdb_close((fdb_file_handle *)auStack_b68._16_8_);
  ppfStack_b90 = (fdb_kvs_handle **)0x118a0c;
  fdb_close((fdb_file_handle *)auStack_b68._0_8_);
  ppfStack_b90 = (fdb_kvs_handle **)0x118a16;
  fdb_close(pfStack_b50);
  ppfStack_b90 = (fdb_kvs_handle **)0x118a2d;
  fdb_open((fdb_file_handle **)(auStack_b68 + 0x10),"dummy1",&fStack_a20);
  ppfStack_b90 = (fdb_kvs_handle **)0x118a3f;
  fdb_kvs_open_default((fdb_file_handle *)auStack_b68._16_8_,&pfStack_b70,&fStack_b40);
  uVar14 = 0;
  do {
    ppfStack_b90 = (fdb_kvs_handle **)0x118a6b;
    fdb_doc_create(&pfStack_b78,apfStack_b28[uVar14]->key,apfStack_b28[uVar14]->keylen,(void *)0x0,0
                   ,(void *)0x0,0);
    ppfStack_b90 = (fdb_kvs_handle **)0x118a7a;
    fVar3 = fdb_get(pfStack_b70,pfStack_b78);
    if ((int)uVar14 - 8U < 0xfffffffe) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118d93;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118d98;
    ppfStack_b90 = (fdb_kvs_handle **)0x118a9e;
    fdb_doc_free(pfStack_b78);
    pfStack_b78 = (fdb_doc *)0x0;
    uVar14 = uVar14 + 1;
  } while (uVar14 != 10);
  pfVar9 = (fdb_config *)auStack_b68;
  ppfStack_b90 = (fdb_kvs_handle **)0x118ad2;
  fdb_open((fdb_file_handle **)pfVar9,"dummy1",&fStack_a20);
  ptr_fhandle = &pfStack_b50;
  ppfStack_b90 = (fdb_kvs_handle **)0x118ae5;
  fdb_open(ptr_fhandle,"dummy1",&fStack_a20);
  ptr_handle_01 = (fdb_kvs_handle **)(auStack_b68 + 8);
  ppfStack_b90 = (fdb_kvs_handle **)0x118afe;
  fdb_kvs_open_default((fdb_file_handle *)auStack_b68._0_8_,ptr_handle_01,&fStack_b40);
  ppfStack_b90 = (fdb_kvs_handle **)0x118b12;
  fdb_kvs_open_default(pfStack_b50,&pfStack_b48,&fStack_b40);
  ppfStack_b90 = (fdb_kvs_handle **)0x118b20;
  fdb_begin_transaction((fdb_file_handle *)auStack_b68._0_8_,'\x02');
  ptr_handle = &pfStack_b70;
  ppfStack_b90 = (fdb_kvs_handle **)0x118b36;
  fdb_set(pfStack_b70,apfStack_b28[10]);
  ppfStack_b90 = (fdb_kvs_handle **)0x118b48;
  fdb_commit((fdb_file_handle *)auStack_b68._16_8_,'\x01');
  ppfStack_b90 = (fdb_kvs_handle **)0x118b59;
  fdb_set(pfStack_b70,apfStack_b28[0xb]);
  ppfStack_b90 = (fdb_kvs_handle **)0x118b69;
  fdb_set((fdb_kvs_handle *)auStack_b68._8_8_,apfStack_b28[0xc]);
  ppfStack_b90 = (fdb_kvs_handle **)0x118b76;
  fdb_commit((fdb_file_handle *)auStack_b68._16_8_,'\x01');
  ppfStack_b90 = (fdb_kvs_handle **)0x118b86;
  fdb_set((fdb_kvs_handle *)auStack_b68._8_8_,apfStack_b28[0xd]);
  ppfStack_b90 = (fdb_kvs_handle **)0x118b94;
  fdb_begin_transaction(pfStack_b50,'\x02');
  ppfStack_b90 = (fdb_kvs_handle **)0x118ba4;
  fdb_set(pfStack_b48,apfStack_b28[0xe]);
  ppfStack_b90 = (fdb_kvs_handle **)0x118bb2;
  fdb_end_transaction((fdb_file_handle *)auStack_b68._0_8_,'\x01');
  ppfStack_b90 = (fdb_kvs_handle **)0x118bc2;
  fdb_set(pfStack_b48,apfStack_b28[0xf]);
  ppfStack_b90 = (fdb_kvs_handle **)0x118bd3;
  fdb_set(pfStack_b70,apfStack_b28[0x10]);
  ppfStack_b90 = (fdb_kvs_handle **)0x118be1;
  fdb_end_transaction(pfStack_b50,'\x01');
  ppfStack_b90 = (fdb_kvs_handle **)0x118bf2;
  fdb_set(pfStack_b70,apfStack_b28[0x11]);
  uVar14 = 0;
  ppfStack_b90 = (fdb_kvs_handle **)0x118bff;
  fdb_commit((fdb_file_handle *)auStack_b68._16_8_,'\0');
  ppfStack_b90 = (fdb_kvs_handle **)0x118c07;
  fdb_close((fdb_file_handle *)auStack_b68._16_8_);
  ppfStack_b90 = (fdb_kvs_handle **)0x118c10;
  fdb_close((fdb_file_handle *)auStack_b68._0_8_);
  ppfStack_b90 = (fdb_kvs_handle **)0x118c19;
  fdb_close(pfStack_b50);
  ppfStack_b90 = (fdb_kvs_handle **)0x118c30;
  fdb_open((fdb_file_handle **)(auStack_b68 + 0x10),"dummy1",&fStack_a20);
  ppfStack_b90 = (fdb_kvs_handle **)0x118c40;
  fdb_kvs_open_default((fdb_file_handle *)auStack_b68._16_8_,ptr_handle,&fStack_b40);
  while( true ) {
    ppfStack_b90 = (fdb_kvs_handle **)0x118c6c;
    fdb_doc_create(&pfStack_b78,apfStack_b28[uVar14 + 10]->key,apfStack_b28[uVar14 + 10]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_b90 = (fdb_kvs_handle **)0x118c7b;
    fVar3 = fdb_get(pfStack_b70,pfStack_b78);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ppfStack_b90 = (fdb_kvs_handle **)0x118c8d;
    fdb_doc_free(pfStack_b78);
    pfStack_b78 = (fdb_doc *)0x0;
    uVar14 = uVar14 + 1;
    if (uVar14 == 8) {
      ppfStack_b90 = (fdb_kvs_handle **)0x118cbb;
      fdb_open((fdb_file_handle **)auStack_b68,"dummy1",&fStack_a20);
      ppfStack_b90 = (fdb_kvs_handle **)0x118cd0;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_b68._0_8_,(fdb_kvs_handle **)(auStack_b68 + 8),
                 &fStack_b40);
      ppfStack_b90 = (fdb_kvs_handle **)0x118cdd;
      fdb_begin_transaction((fdb_file_handle *)auStack_b68._0_8_,'\x02');
      ppfStack_b90 = (fdb_kvs_handle **)0x118ced;
      fdb_set((fdb_kvs_handle *)auStack_b68._8_8_,apfStack_b28[0x14]);
      ppfStack_b90 = (fdb_kvs_handle **)0x118cfe;
      fdb_compact((fdb_file_handle *)auStack_b68._16_8_,"dummy2");
      ppfStack_b90 = (fdb_kvs_handle **)0x118d0b;
      fdb_end_transaction((fdb_file_handle *)auStack_b68._0_8_,'\x01');
      ppfStack_b90 = (fdb_kvs_handle **)0x118d15;
      fdb_close((fdb_file_handle *)auStack_b68._16_8_);
      ppfStack_b90 = (fdb_kvs_handle **)0x118d1d;
      fdb_close((fdb_file_handle *)auStack_b68._0_8_);
      lVar10 = 0;
      do {
        ppfStack_b90 = (fdb_kvs_handle **)0x118d29;
        fdb_doc_free(apfStack_b28[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x1e);
      ppfStack_b90 = (fdb_kvs_handle **)0x118d37;
      fdb_shutdown();
      ppfStack_b90 = (fdb_kvs_handle **)0x118d3c;
      memleak_end();
      pcVar15 = "%s PASSED\n";
      if (last_wal_flush_header_test()::__test_pass != '\0') {
        pcVar15 = "%s FAILED\n";
      }
      ppfStack_b90 = (fdb_kvs_handle **)0x118d6d;
      fprintf(_stderr,pcVar15,"last wal flush header test");
      return;
    }
  }
LAB_00118d84:
  ppfStack_b90 = (fdb_kvs_handle **)0x118d89;
  last_wal_flush_header_test();
LAB_00118d89:
  ppfStack_b90 = (fdb_kvs_handle **)0x118d8e;
  last_wal_flush_header_test();
LAB_00118d8e:
  ppfStack_b90 = (fdb_kvs_handle **)0x118d93;
  last_wal_flush_header_test();
LAB_00118d93:
  ppfStack_b90 = (fdb_kvs_handle **)0x118d98;
  last_wal_flush_header_test();
LAB_00118d98:
  ppfStack_b90 = (fdb_kvs_handle **)long_key_test;
  last_wal_flush_header_test();
  pfStack_16dd8 = (fdb_doc *)0x118dba;
  ppfStack_bb8 = &pfStack_b78;
  pfStack_bb0 = pfVar9;
  ppfStack_ba8 = ptr_fhandle;
  uStack_ba0 = uVar14;
  ppfStack_b98 = ptr_handle_01;
  ppfStack_b90 = ptr_handle;
  gettimeofday(&tStack_16d70,(__timezone_ptr_t)0x0);
  pfStack_16dd8 = (fdb_doc *)0x118dbf;
  memleak_start();
  pfStack_16dc0 = (fdb_doc *)0x0;
  pfStack_16dd8 = (fdb_doc *)0x118dd4;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_16dd8 = (fdb_doc *)0x118de4;
  fdb_get_default_config();
  pfStack_16dd8 = (fdb_doc *)0x118df1;
  fdb_get_default_kvs_config();
  fStack_16af8.flags = 1;
  fStack_16af8.purging_interval = 0;
  fStack_16af8.compaction_threshold = '\0';
  fStack_16af8.durability_opt = '\x02';
  pfStack_16dd8 = (fdb_doc *)0x118e1e;
  fdb_open(&pfStack_16db8,"dummy1",&fStack_16af8);
  pfStack_16dd8 = (fdb_doc *)0x118e2e;
  fdb_kvs_open_default(pfStack_16db8,&pfStack_16da8,&fStack_16d60);
  ppfVar11 = apfStack_16900;
  __s = afStack_16d00;
  pfVar12 = (fdb_doc *)0x0;
  lVar10 = 0;
  do {
    sVar5 = 0xff7f;
    if (lVar10 == 1) {
      sVar5 = 0x1fff;
    }
    if (lVar10 == 0) {
      sVar5 = 0x7fff;
    }
    pfStack_16dd8 = (fdb_doc *)0x118e7c;
    lStack_16da0 = lVar10;
    memset(asStack_10b40,0x5f,sVar5);
    *(undefined1 *)((long)asStack_10b40 + sVar5) = 0;
    lVar10 = 0;
    doc_01 = ppfVar11;
    lStack_16d98 = (long)pfVar12;
    ppfStack_16d90 = ppfVar11;
    sStack_16d78 = sVar5;
    do {
      pfStack_16dd8 = (fdb_doc *)0x118eb2;
      lStack_16d88 = lVar10;
      sprintf((char *)__s,"%08d");
      asStack_10b40[0] = afStack_16d00[0].keylen;
      uVar14 = 0;
      lStack_16db0 = (long)pfVar12;
      ppfStack_16d80 = doc_01;
      do {
        pfStack_16dd8 = (fdb_doc *)0x118eee;
        sprintf((char *)__s,"%08d",uVar14 & 0xffffffff);
        *(size_t *)((long)apfStack_16900 + sStack_16d78 + 0x5db8) = afStack_16d00[0].keylen;
        uVar13 = (int)lStack_16db0 + (int)uVar14;
        pfStack_16dd8 = (fdb_doc *)0x118f27;
        sprintf(acStack_16a00,"meta%d",(ulong)uVar13);
        pfStack_16dd8 = (fdb_doc *)0x118f3a;
        sprintf(acStack_16c00,"body%d",(ulong)uVar13);
        pfStack_16dd8 = (fdb_doc *)0x118f47;
        sVar5 = strlen((char *)asStack_10b40);
        pfStack_16dd8 = (fdb_doc *)0x118f53;
        sVar6 = strlen(acStack_16a00);
        pfStack_16dd8 = (fdb_doc *)0x118f67;
        sVar7 = strlen(acStack_16c00);
        lVar1 = lStack_16db0;
        pcVar15 = acStack_16c00;
        pfStack_16dd8 = (fdb_doc *)0x118f9a;
        fdb_doc_create(doc_01,asStack_10b40,sVar5 + 1,acStack_16a00,sVar6 + 1,pcVar15,sVar7 + 1);
        uVar14 = uVar14 + 1;
        doc_01 = doc_01 + 1;
      } while (uVar14 != 10);
      lVar10 = lStack_16d88 + 1;
      doc_01 = ppfStack_16d80 + 10;
      pfVar12 = (fdb_doc *)(lVar1 + 10);
    } while (lVar10 != 100);
    lVar10 = lStack_16da0 + 1;
    ppfVar11 = ppfStack_16d90 + 1000;
    pfVar12 = (fdb_doc *)(lStack_16d98 + 1000);
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pfStack_16dd8 = (fdb_doc *)0x119010;
    fdb_set(pfStack_16da8,apfStack_16900[lVar10]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3000);
  pfStack_16dd8 = (fdb_doc *)0x11902b;
  fdb_commit(pfStack_16db8,'\x01');
  pfStack_16dd8 = (fdb_doc *)0x119040;
  fdb_get_file_info(pfStack_16db8,&fStack_16d48);
  if (fStack_16d48.doc_count != 3000) {
    pfStack_16dd8 = (fdb_doc *)0x119057;
    long_key_test();
  }
  lVar10 = 0;
  while( true ) {
    pfStack_16dd8 = (fdb_doc *)0x119086;
    fdb_doc_create(&pfStack_16dc0,apfStack_16900[lVar10]->key,apfStack_16900[lVar10]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_16dd8 = (fdb_doc *)0x119095;
    fVar3 = fdb_get(pfStack_16da8,pfStack_16dc0);
    doc = pfStack_16dc0;
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    doc_01 = (fdb_doc **)pfStack_16dc0->key;
    __s = apfStack_16900[lVar10];
    pcVar15 = (char *)__s->key;
    pfStack_16dd8 = (fdb_doc *)0x1190c0;
    iVar4 = bcmp(doc_01,pcVar15,pfStack_16dc0->keylen);
    pfVar12 = doc;
    if (iVar4 != 0) {
      pfStack_16dd8 = (fdb_doc *)0x1191a4;
      long_key_test();
      break;
    }
    doc_01 = (fdb_doc **)doc->meta;
    pcVar15 = (char *)__s->meta;
    pfStack_16dd8 = (fdb_doc *)0x1190df;
    iVar4 = bcmp(doc_01,pcVar15,doc->metalen);
    if (iVar4 != 0) goto LAB_001191b4;
    doc_01 = (fdb_doc **)doc->body;
    pcVar15 = (char *)__s->body;
    pfStack_16dd8 = (fdb_doc *)0x1190fe;
    iVar4 = bcmp(doc_01,pcVar15,doc->bodylen);
    if (iVar4 != 0) goto LAB_001191a9;
    pfStack_16dd8 = (fdb_doc *)0x11910e;
    fdb_doc_free(doc);
    pfStack_16dc0 = (fdb_doc *)0x0;
    lVar10 = lVar10 + 1;
    if (lVar10 == 3000) {
      pfStack_16dd8 = (fdb_doc *)0x119131;
      fdb_close(pfStack_16db8);
      lVar10 = 0;
      do {
        pfStack_16dd8 = (fdb_doc *)0x119140;
        fdb_doc_free(apfStack_16900[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3000);
      pfStack_16dd8 = (fdb_doc *)0x119151;
      fdb_shutdown();
      pfStack_16dd8 = (fdb_doc *)0x119156;
      memleak_end();
      pcVar15 = "%s PASSED\n";
      if (long_key_test()::__test_pass != '\0') {
        pcVar15 = "%s FAILED\n";
      }
      pfStack_16dd8 = (fdb_doc *)0x119187;
      fprintf(_stderr,pcVar15,"long key test");
      return;
    }
  }
  pfStack_16dd8 = (fdb_doc *)0x1191a9;
  long_key_test();
LAB_001191a9:
  pfStack_16dd8 = (fdb_doc *)0x1191b4;
  long_key_test();
LAB_001191b4:
  pfStack_16dd8 = (fdb_doc *)open_multi_files_kvs_test;
  long_key_test();
  pfStack_1b2d0 = (fdb_kvs_handle *)0x1191df;
  ppfStack_16e00 = &pfStack_16dc0;
  pcStack_16df8 = pcVar15;
  lStack_16df0 = lVar10;
  pfStack_16de8 = pfVar12;
  ppfStack_16de0 = doc_01;
  pfStack_16dd8 = __s;
  gettimeofday((timeval *)(auStack_1b248 + 0x30),(__timezone_ptr_t)0x0);
  pfStack_1b2d0 = (fdb_kvs_handle *)0x1191e4;
  memleak_start();
  pfStack_1b2d0 = (fdb_kvs_handle *)0x1191f0;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_1b2d0 = (fdb_kvs_handle *)0x119200;
  fdb_get_default_config();
  pfStack_1b2d0 = (fdb_kvs_handle *)0x11920a;
  fdb_get_default_kvs_config();
  fStack_1b100.wal_threshold = 0x400;
  fStack_1b100.compaction_mode = '\0';
  fStack_1b100.durability_opt = '\x02';
  handle = (char *)&fStack_1ae08;
  doc_00 = apfStack_1b008;
  pcVar15 = "kvs%d";
  uVar14 = 0;
  ptr_iterator = (fdb_iterator **)0x0;
  do {
    pfStack_1b2d0 = (fdb_kvs_handle *)0x11924a;
    sprintf((char *)doc_00,"dummy%d",(ulong)ptr_iterator & 0xffffffff);
    ptr_handle_00 = (char *)(apfStack_1b288 + (long)ptr_iterator);
    pfStack_1b2d0 = (fdb_kvs_handle *)0x119265;
    fVar3 = fdb_open((fdb_file_handle **)ptr_handle_00,(char *)doc_00,&fStack_1b100);
    pfVar8 = (fdb_kvs_handle *)handle;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011969e;
    ppfVar2 = (fdb_iterator **)0x0;
    ppfStack_1b2b0 = ptr_iterator;
    pfStack_1b2a8 = (fdb_kvs_handle *)handle;
    do {
      ptr_iterator = ppfVar2;
      pfStack_1b2d0 = (fdb_kvs_handle *)0x11928b;
      sprintf((char *)doc_00,"kvs%d",(ulong)(uint)((int)ptr_iterator + (int)uVar14));
      pfStack_1b2d0 = (fdb_kvs_handle *)0x11929e;
      fVar3 = fdb_kvs_open((fdb_file_handle *)*(fdb_kvs_handle **)ptr_handle_00,
                           (fdb_kvs_handle **)handle,(char *)doc_00,&fStack_1b2a0);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_1b2d0 = (fdb_kvs_handle *)0x11968a;
        open_multi_files_kvs_test();
        goto LAB_0011968a;
      }
      handle = (char *)&(((fdb_kvs_handle *)handle)->kvs_config).custom_cmp;
      ppfVar2 = (fdb_iterator **)((long)ptr_iterator + 1);
    } while ((fdb_iterator **)((long)ptr_iterator + 1) != (fdb_iterator **)0x80);
    ptr_iterator = (fdb_iterator **)((long)ppfStack_1b2b0 + 1);
    uVar14 = uVar14 + 0x80;
    handle = (char *)&pfStack_1b2a8[1].bub_ctx.space_used;
  } while (ptr_iterator != (fdb_iterator **)0x8);
  ptr_iterator = apfStack_1b208;
  doc_00 = apfStack_1af08;
  pfVar8 = (fdb_kvs_handle *)0x0;
  do {
    uVar14 = 0;
    do {
      pfStack_1b2d0 = (fdb_kvs_handle *)0x119300;
      sprintf((char *)ptr_iterator,"key%08d",uVar14);
      pfStack_1b2d0 = (fdb_kvs_handle *)0x119313;
      sprintf((char *)doc_00,"value%08d",uVar14);
      pcVar15 = *(char **)(&fStack_1ae08.kvs_config.create_if_missing + (long)pfVar8 * 8);
      pfStack_1b2d0 = (fdb_kvs_handle *)0x119323;
      sVar5 = strlen((char *)ptr_iterator);
      ptr_handle_00 = (char *)(sVar5 + 1);
      pfStack_1b2d0 = (fdb_kvs_handle *)0x11932f;
      sVar5 = strlen((char *)doc_00);
      pfStack_1b2d0 = (fdb_kvs_handle *)0x119344;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)pcVar15,ptr_iterator,(size_t)ptr_handle_00,doc_00,
                         sVar5 + 1);
      handle = (char *)pfVar8;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011968a;
      uVar13 = (int)uVar14 + 1;
      uVar14 = (ulong)uVar13;
    } while (uVar13 != 10);
    pfVar8 = (fdb_kvs_handle *)&(pfVar8->kvs_config).field_0x1;
  } while (pfVar8 != (fdb_kvs_handle *)0x400);
  ptr_handle_00 = (char *)0x0;
  do {
    if (((ulong)ptr_handle_00 & 1) == 0) {
      pfStack_1b2d0 = (fdb_kvs_handle *)0x119372;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1b288[(long)ptr_handle_00],'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196bc;
    }
    else {
      pfStack_1b2d0 = (fdb_kvs_handle *)0x119385;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1b288[(long)ptr_handle_00],'\x01');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c1;
    }
    ptr_handle_00 = (char *)((long)ptr_handle_00 + 1);
  } while ((fdb_kvs_handle **)ptr_handle_00 != (fdb_kvs_handle **)0x8);
  doc_00 = (fdb_iterator **)0xffffffffffffff80;
  ptr_handle_00 = (char *)apfStack_18e08;
  ptr_iterator = (fdb_iterator **)(auStack_1b248 + 8);
  pfVar8 = (fdb_kvs_handle *)auStack_1b248;
  do {
    pfStack_1b2d0 = (fdb_kvs_handle *)0x1193c5;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1aa08[(long)doc_00],(fdb_kvs_info *)pfVar8);
    if ((fdb_custom_cmp_variable)auStack_1b248._8_8_ != (fdb_custom_cmp_variable)0xa) {
      pfStack_1b2d0 = (fdb_kvs_handle *)0x11940b;
      open_multi_files_kvs_test();
    }
    pfStack_1b2d0 = (fdb_kvs_handle *)0x1193e5;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1aa08[(long)doc_00],
                              (fdb_kvs_handle **)ptr_handle_00,10);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a3;
    doc_00 = doc_00 + 0x10;
    ptr_handle_00 = (char *)((long)ptr_handle_00 + 0x400);
  } while (doc_00 < (fdb_iterator **)0x380);
  ptr_handle_00 = (char *)0x0;
  do {
    pfStack_1b2d0 = (fdb_kvs_handle *)0x11941b;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1b288[(long)ptr_handle_00],(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a8;
    ptr_handle_00 = (char *)((long)ptr_handle_00 + 1);
  } while ((fdb_kvs_handle **)ptr_handle_00 != (fdb_kvs_handle **)0x8);
  ptr_handle_00 = (char *)&pfStack_1b2b8;
  pfStack_1b2b8 = (fdb_kvs_handle *)0x0;
  ptr_iterator = &pfStack_1b2c0;
  handle = "key%08d";
  doc_00 = apfStack_1b208;
  pfVar8 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1b2d0 = (fdb_kvs_handle *)0x119470;
    fdb_iterator_init(apfStack_18e08[(long)pfVar8],ptr_iterator,(void *)0x0,0,(void *)0x0,0,0);
    uVar14 = 0;
    do {
      pfStack_1b2d0 = (fdb_kvs_handle *)0x11947f;
      fVar3 = fdb_iterator_get(pfStack_1b2c0,(fdb_doc **)ptr_handle_00);
      pcVar15 = (char *)pfVar8;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011968f;
      pfStack_1b2d0 = (fdb_kvs_handle *)0x119496;
      sprintf((char *)doc_00,"key%08d",uVar14);
      pfStack_1b2d0 = (fdb_kvs_handle *)0x1194a7;
      iVar4 = strcmp((char *)doc_00,(char *)pfStack_1b2b8->op_stats);
      if (iVar4 != 0) {
        pfStack_1b2d0 = (fdb_kvs_handle *)0x1194c9;
        open_multi_files_kvs_test();
      }
      uVar14 = (ulong)((int)uVar14 + 1);
      pfStack_1b2d0 = (fdb_kvs_handle *)0x1194b7;
      fVar3 = fdb_iterator_next(pfStack_1b2c0);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1b2d0 = (fdb_kvs_handle *)0x1194d5;
    fdb_iterator_close(pfStack_1b2c0);
    pcVar15 = (char *)&(pfVar8->config).wal_threshold;
    bVar16 = pfVar8 < (fdb_kvs_handle *)0x380;
    pfVar8 = (fdb_kvs_handle *)pcVar15;
  } while (bVar16);
  pfStack_1b2d0 = (fdb_kvs_handle *)0x1194f6;
  fdb_doc_free((fdb_doc *)pfStack_1b2b8);
  ptr_handle_00 = "key%08d";
  ptr_iterator = apfStack_1b208;
  doc_00 = (fdb_iterator **)0x0;
  do {
    uVar14 = 0;
    do {
      pfStack_1b2d0 = (fdb_kvs_handle *)0x119519;
      sprintf((char *)ptr_iterator,"key%08d",uVar14);
      handle = *(char **)(&fStack_1ae08.kvs_config.create_if_missing + (long)doc_00 * 8);
      pfStack_1b2d0 = (fdb_kvs_handle *)0x119529;
      sVar5 = strlen((char *)ptr_iterator);
      pfStack_1b2d0 = (fdb_kvs_handle *)0x119538;
      fVar3 = fdb_del_kv((fdb_kvs_handle *)handle,ptr_iterator,sVar5 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119694;
      uVar13 = (int)uVar14 + 1;
      uVar14 = (ulong)uVar13;
    } while (uVar13 != 10);
    doc_00 = (fdb_iterator **)((long)doc_00 + 1);
  } while (doc_00 != (fdb_iterator **)0x400);
  ptr_handle_00 = "dummy_compact%d";
  ptr_iterator = apfStack_1b008;
  pfVar8 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1b2d0 = (fdb_kvs_handle *)0x119575;
    sprintf((char *)ptr_iterator,"dummy_compact%d",(ulong)pfVar8 & 0xffffffff);
    pfStack_1b2d0 = (fdb_kvs_handle *)0x119582;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1b288[(long)pfVar8],(char *)ptr_iterator);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ad;
    pfVar8 = (fdb_kvs_handle *)&(pfVar8->kvs_config).field_0x1;
  } while (pfVar8 != (fdb_kvs_handle *)0x8);
  ptr_handle_00 = (char *)&pfStack_1b2b8;
  pfStack_1b2b8 = (fdb_kvs_handle *)0x0;
  ptr_iterator = &pfStack_1b2c0;
  handle = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfStack_1b2d0 = (fdb_kvs_handle *)0x1195c8;
    fVar3 = fdb_iterator_init(*(fdb_kvs_handle **)
                               (&fStack_1ae08.kvs_config.create_if_missing + (long)handle * 8),
                              ptr_iterator,(void *)0x0,0,(void *)0x0,0,2);
    pfVar8 = (fdb_kvs_handle *)handle;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b2;
    do {
      pfStack_1b2d0 = (fdb_kvs_handle *)0x1195dd;
      fVar3 = fdb_iterator_get(pfStack_1b2c0,(fdb_doc **)ptr_handle_00);
      if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00119699;
      pfStack_1b2d0 = (fdb_kvs_handle *)0x1195ef;
      fVar3 = fdb_iterator_next(pfStack_1b2c0);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1b2d0 = (fdb_kvs_handle *)0x1195fe;
    fdb_iterator_close(pfStack_1b2c0);
    pfVar8 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)handle)->config).wal_threshold;
    bVar16 = handle < (fdb_kvs_handle *)0x380;
    handle = (char *)pfVar8;
  } while (bVar16);
  pfStack_1b2d0 = (fdb_kvs_handle *)0x11961b;
  fdb_doc_free((fdb_doc *)pfStack_1b2b8);
  ptr_handle_00 = (char *)0x0;
  while( true ) {
    pfStack_1b2d0 = (fdb_kvs_handle *)0x119627;
    fVar3 = fdb_close((fdb_file_handle *)apfStack_1b288[(long)ptr_handle_00]);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ptr_handle_00 = (char *)((long)ptr_handle_00 + 1);
    if ((fdb_kvs_handle **)ptr_handle_00 == (fdb_kvs_handle **)0x8) {
      pfStack_1b2d0 = (fdb_kvs_handle *)0x11963d;
      fdb_shutdown();
      pfStack_1b2d0 = (fdb_kvs_handle *)0x119642;
      memleak_end();
      pcVar15 = "%s PASSED\n";
      if (open_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar15 = "%s FAILED\n";
      }
      pfStack_1b2d0 = (fdb_kvs_handle *)0x119673;
      fprintf(_stderr,pcVar15,"open multi files kvs test");
      return;
    }
  }
LAB_001196b7:
  pfStack_1b2d0 = (fdb_kvs_handle *)0x1196bc;
  open_multi_files_kvs_test();
LAB_001196bc:
  pfStack_1b2d0 = (fdb_kvs_handle *)0x1196c1;
  open_multi_files_kvs_test();
LAB_001196c1:
  pfStack_1b2d0 = (fdb_kvs_handle *)get_byoffset_diff_kvs_test;
  open_multi_files_kvs_test();
  pcStack_1b648 = (code *)0x1196e0;
  ppfStack_1b2e8 = (fdb_kvs_handle **)ptr_handle_00;
  ppfStack_1b2e0 = doc_00;
  ppfStack_1b2d8 = ptr_iterator;
  pfStack_1b2d0 = pfVar8;
  gettimeofday(&tStack_1b5f8,(__timezone_ptr_t)0x0);
  pcStack_1b648 = (code *)0x1196e5;
  memleak_start();
  pcStack_1b648 = (code *)0x1196f1;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar9 = &fStack_1b5e8;
  pcStack_1b648 = (code *)0x1196fe;
  fdb_get_default_config();
  pcStack_1b648 = (code *)0x119708;
  fdb_get_default_kvs_config();
  pcStack_1b648 = (code *)0x11971c;
  fVar3 = fdb_open(&pfStack_1b628,"./dummy1",pfVar9);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_1b648 = (code *)0x11973f;
    fVar3 = fdb_kvs_open(pfStack_1b628,&pfStack_1b620,"db",&fStack_1b610);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001198f2;
    pcStack_1b648 = (code *)0x119762;
    fVar3 = fdb_kvs_open(pfStack_1b628,&pfStack_1b618,"db2",&fStack_1b610);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001198f7;
    pfVar9 = &fStack_1b3f0;
    pcStack_1b648 = (code *)0x119785;
    sprintf((char *)pfVar9,"key%d",0);
    ptr_iterator = apfStack_1b4f0;
    pcStack_1b648 = (code *)0x1197a0;
    sprintf((char *)ptr_iterator,"body%d",0);
    pcStack_1b648 = (code *)0x1197a8;
    pfVar8 = (fdb_kvs_handle *)strlen((char *)pfVar9);
    pcStack_1b648 = (code *)0x1197b3;
    sVar5 = strlen((char *)ptr_iterator);
    doc_00 = &pfStack_1b630;
    pcStack_1b648 = (code *)0x1197d5;
    fdb_doc_create((fdb_doc **)doc_00,pfVar9,(size_t)pfVar8,(void *)0x0,0,ptr_iterator,sVar5 + 1);
    pcStack_1b648 = (code *)0x1197e3;
    fVar3 = fdb_set(pfStack_1b620,(fdb_doc *)pfStack_1b630);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001198fc;
    pcStack_1b648 = (code *)0x1197fa;
    fVar3 = fdb_commit(pfStack_1b628,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119901;
    pcStack_1b648 = (code *)0x11981b;
    sprintf((char *)pfStack_1b630->tree_cursor_prev,"bOdy%d",0);
    pcStack_1b648 = (code *)0x11982a;
    fVar3 = fdb_set(pfStack_1b618,(fdb_doc *)pfStack_1b630);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119906;
    pcStack_1b648 = (code *)0x119841;
    fVar3 = fdb_commit(pfStack_1b628,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011990b;
    pcStack_1b648 = (code *)0x119858;
    fVar3 = fdb_get_metaonly(pfStack_1b620,(fdb_doc *)pfStack_1b630);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119910;
    pcStack_1b648 = (code *)0x11986f;
    fVar3 = fdb_get_metaonly(pfStack_1b618,(fdb_doc *)pfStack_1b630);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119915;
    pcStack_1b648 = (code *)0x119886;
    fVar3 = fdb_get_byoffset(pfStack_1b620,(fdb_doc *)pfStack_1b630);
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      pcStack_1b648 = (code *)0x119899;
      fdb_close(pfStack_1b628);
      pcStack_1b648 = (code *)0x1198a3;
      fdb_doc_free((fdb_doc *)pfStack_1b630);
      pcStack_1b648 = (code *)0x1198a8;
      fdb_shutdown();
      pcStack_1b648 = (code *)0x1198ad;
      memleak_end();
      pcVar15 = "%s PASSED\n";
      if (get_byoffset_diff_kvs_test()::__test_pass != '\0') {
        pcVar15 = "%s FAILED\n";
      }
      pcStack_1b648 = (code *)0x1198de;
      fprintf(_stderr,pcVar15,"get byoffset diff kvs");
      return;
    }
  }
  else {
    pcStack_1b648 = (code *)0x1198f2;
    get_byoffset_diff_kvs_test();
LAB_001198f2:
    pcStack_1b648 = (code *)0x1198f7;
    get_byoffset_diff_kvs_test();
LAB_001198f7:
    pcStack_1b648 = (code *)0x1198fc;
    get_byoffset_diff_kvs_test();
LAB_001198fc:
    pcStack_1b648 = (code *)0x119901;
    get_byoffset_diff_kvs_test();
LAB_00119901:
    pcStack_1b648 = (code *)0x119906;
    get_byoffset_diff_kvs_test();
LAB_00119906:
    pcStack_1b648 = (code *)0x11990b;
    get_byoffset_diff_kvs_test();
LAB_0011990b:
    pcStack_1b648 = (code *)0x119910;
    get_byoffset_diff_kvs_test();
LAB_00119910:
    pcStack_1b648 = (code *)0x119915;
    get_byoffset_diff_kvs_test();
LAB_00119915:
    pcStack_1b648 = (code *)0x11991a;
    get_byoffset_diff_kvs_test();
  }
  pcStack_1b648 = rekey_test;
  get_byoffset_diff_kvs_test();
  pfStack_1b670 = pfVar9;
  ppfStack_1b668 = doc_00;
  pfStack_1b660 = (fdb_kvs_handle *)pcVar15;
  ppfStack_1b658 = ptr_iterator;
  pfStack_1b650 = pfVar8;
  pcStack_1b648 = (code *)uVar14;
  gettimeofday(&tStack_1ba80,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_1ba70.wal_threshold = 0x400;
  fStack_1ba70.flags = 1;
  fStack_1ba70.purging_interval = 0;
  fStack_1ba70.compaction_threshold = '\0';
  fStack_1ba70.encryption_key.algorithm = -1;
  builtin_memcpy(fStack_1ba70.encryption_key.bytes,"BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB",0x20);
  fdb_open(&pfStack_1bad8,"./dummy1",&fStack_1ba70);
  fdb_kvs_open_default(pfStack_1bad8,&pfStack_1bae0,&fStack_1ba98);
  fVar3 = fdb_set_log_callback(pfStack_1bae0,logCallbackFunc,"api_wrapper_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fVar3 = fdb_set_kv(pfStack_1bae0,(void *)0x0,0,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_00119c74;
    uVar14 = 0;
    do {
      sprintf(acStack_1b878,"key%d",uVar14);
      sprintf(acStack_1b778,"body%d",uVar14);
      pfVar8 = pfStack_1bae0;
      sVar5 = strlen(acStack_1b878);
      sVar6 = strlen(acStack_1b778);
      fVar3 = fdb_set_kv(pfVar8,acStack_1b878,sVar5,acStack_1b778,sVar6);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        rekey_test();
        goto LAB_00119c56;
      }
      uVar13 = (int)uVar14 + 1;
      uVar14 = (ulong)uVar13;
    } while (uVar13 != 10);
    asStack_1bac8[1] = 0x726162ffffffff;
    asStack_1bac8[2] = 0xbdbdbdbdbdbdbdbd;
    uStack_1bab0 = 0xbdbdbdbd;
    uStack_1baac = 0xbdbdbdbd;
    uStack_1baa8 = 0xbdbdbdbd;
    uStack_1baa4 = 0xbdbdbdbd;
    uStack_1baa0 = 0xbdbdbdbd;
    new_key.bytes[4] = 0xbd;
    new_key.bytes[5] = 0xbd;
    new_key.bytes[6] = 0xbd;
    new_key.bytes[7] = 0xbd;
    new_key.bytes[8] = 0xbd;
    new_key.bytes[9] = 0xbd;
    new_key.bytes[10] = 0xbd;
    new_key.bytes[0xb] = 0xbd;
    new_key.algorithm = -1;
    new_key.bytes[0] = 'b';
    new_key.bytes[1] = 'a';
    new_key.bytes[2] = 'r';
    new_key.bytes[3] = '\0';
    new_key.bytes[0xc] = 0xbd;
    new_key.bytes[0xd] = 0xbd;
    new_key.bytes[0xe] = 0xbd;
    new_key.bytes[0xf] = 0xbd;
    new_key.bytes[0x10] = 0xbd;
    new_key.bytes[0x11] = 0xbd;
    new_key.bytes[0x12] = 0xbd;
    new_key.bytes[0x13] = 0xbd;
    new_key.bytes[0x14] = 0xbd;
    new_key.bytes[0x15] = 0xbd;
    new_key.bytes[0x16] = 0xbd;
    new_key.bytes[0x17] = 0xbd;
    new_key.bytes[0x18] = 0xbd;
    new_key.bytes[0x19] = 0xbd;
    new_key.bytes[0x1a] = 0xbd;
    new_key.bytes[0x1b] = 0xbd;
    new_key.bytes[0x1c] = 0xbd;
    new_key.bytes[0x1d] = 0xbd;
    new_key.bytes[0x1e] = 0xbd;
    new_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_rekey(pfStack_1bad8,new_key);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119c79;
    fdb_kvs_close(pfStack_1bae0);
    fdb_close(pfStack_1bad8);
    fStack_1ba70.encryption_key.algorithm = -1;
    builtin_memcpy(fStack_1ba70.encryption_key.bytes,"bar",4);
    fStack_1ba70.encryption_key.bytes[4] = 0xbd;
    fStack_1ba70.encryption_key.bytes[5] = 0xbd;
    fStack_1ba70.encryption_key.bytes[6] = 0xbd;
    fStack_1ba70.encryption_key.bytes[7] = 0xbd;
    fStack_1ba70.encryption_key.bytes[8] = 0xbd;
    fStack_1ba70.encryption_key.bytes[9] = 0xbd;
    fStack_1ba70.encryption_key.bytes[10] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0xb] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0xc] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0xd] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0xe] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0xf] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x10] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x11] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x12] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x13] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x14] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x15] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x16] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x17] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x18] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x19] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x1a] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x1b] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x1c] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x1d] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x1e] = 0xbd;
    fStack_1ba70.encryption_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_open(&pfStack_1bad8,"./dummy1",&fStack_1ba70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119c80;
    fVar3 = fdb_kvs_open_default(pfStack_1bad8,&pfStack_1bae0,&fStack_1ba98);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_set_log_callback(pfStack_1bae0,logCallbackFunc,"api_wrapper_test");
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119c8e;
      uVar14 = 0;
      while( true ) {
        sprintf(acStack_1b878,"key%d",uVar14);
        pfVar8 = pfStack_1bae0;
        sVar5 = strlen(acStack_1b878);
        fVar3 = fdb_get_kv(pfVar8,acStack_1b878,sVar5,&pvStack_1bad0,asStack_1bac8);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        sprintf(acStack_1b978,"body%d",uVar14);
        ptr = pvStack_1bad0;
        iVar4 = bcmp(pvStack_1bad0,acStack_1b978,asStack_1bac8[0]);
        if (iVar4 != 0) goto LAB_00119c56;
        fdb_free_block(ptr);
        uVar13 = (int)uVar14 + 1;
        uVar14 = (ulong)uVar13;
        if (uVar13 == 10) {
          fdb_kvs_close(pfStack_1bae0);
          fdb_close(pfStack_1bad8);
          fdb_shutdown();
          memleak_end();
          pcVar15 = "%s PASSED\n";
          if (rekey_test()::__test_pass != '\0') {
            pcVar15 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar15,"encryption rekey test");
          return;
        }
      }
LAB_00119c66:
      rekey_test();
      goto LAB_00119c6d;
    }
  }
  else {
LAB_00119c6d:
    rekey_test();
LAB_00119c74:
    rekey_test();
LAB_00119c79:
    rekey_test();
LAB_00119c80:
    rekey_test();
  }
  rekey_test();
LAB_00119c8e:
  rekey_test();
  return;
}

Assistant:

void auto_commit_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 5000;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;

    char key[256], value[256];
    void *value_out;
    size_t valuelen;

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 4096;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.durability_opt = FDB_DRB_ASYNC;
    fconfig.auto_commit = true;

    // open db
    status = fdb_open(&dbfile, "dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert docs
    for (i=0;i<n;++i){
        sprintf(key, "key%d", i);
        sprintf(value, "body%d", i);
        status = fdb_set_kv(db, key, strlen(key)+1, value, strlen(value)+1);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // retrieve check before close
    for (i=0;i<n;++i){
        sprintf(key, "key%d", i);
        sprintf(value, "body%d", i);
        status = fdb_get_kv(db, key, strlen(key)+1, &value_out, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value_out, value, valuelen);
        fdb_free_block(value_out);
    }

    status = fdb_kvs_close(db);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // close & reopen
    status = fdb_close(dbfile);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_open(&dbfile, "dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // retrieve check again
    for (i=0;i<n;++i){
        sprintf(key, "key%d", i);
        sprintf(value, "body%d", i);
        status = fdb_get_kv(db, key, strlen(key)+1, &value_out, &valuelen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(value_out, value, valuelen);
        fdb_free_block(value_out);
    }

    // free all resources
    status = fdb_close(dbfile);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("auto commit test");
}